

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_session_write(nh_session_t *session)

{
  int iVar1;
  undefined1 local_1c [8];
  epoll_event ev;
  
  session->state = SESSION_WRITE;
  iVar1 = nh_write_socket(&(session->context).response.raw,session->socket);
  if (iVar1 != 0) {
    if ((session->context).response.raw.index != (session->context).response.raw.length) {
      local_1c._0_4_ = 0x80000004;
      unique0x10000150 = session;
      epoll_ctl(session->server->loop,3,session->socket,(epoll_event *)local_1c);
      return;
    }
    if ((session->flags & 4) != 0) {
      return;
    }
    if ((session->flags & 2) != 0) {
      nh_context_clear(&session->context);
      session->state = SESSION_READ;
      session->timeout = session->server->keep_alive_timeout;
      return;
    }
  }
  session->state = SESSION_END;
  return;
}

Assistant:

void nh_session_write(nh_session_t *session) {
    session->state = SESSION_WRITE;
    nh_stream_t *stream = &session->context.response.raw;
    if (!nh_write_socket(stream, session->socket)) {
        // pipe error
        session->state = SESSION_END;
        return;
    }

    if (stream->index != stream->length) {
        // need wait writable
        struct epoll_event ev;
        ev.events = EPOLLOUT | EPOLLET;
        ev.data.ptr = session;
        epoll_ctl(session->server->loop, EPOLL_CTL_MOD, session->socket, &ev);
        return;
    }

#ifndef DISABLE_WEBSOCKET
    if (FLAG_CHECK(session->flags, SESSION_FLAG_UPGRADED)) return;
#endif

    if (FLAG_CHECK(session->flags, SESSION_FLAG_KEEP_ALIVE)) {
        nh_context_clear(&session->context);
        session->state = SESSION_READ;
        session->timeout = session->server->keep_alive_timeout;
    } else {
        session->state = SESSION_END;
    }
}